

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall State::Reset(State *this)

{
  bool bVar1;
  pointer ppVar2;
  reference ppEVar3;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_30;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_28;
  iterator e;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_18;
  iterator i;
  State *this_local;
  
  i.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)
       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)this;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
       ::begin(&this->paths_);
  while( true ) {
    e._M_current = (Edge **)std::
                            unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                            ::end(&this->paths_);
    bVar1 = std::__detail::operator!=
                      (&local_18,
                       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> *)&e);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)
                        &local_18);
    Node::ResetState(ppVar2->second);
    std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)&local_18);
  }
  local_28._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&this->edges_);
  while( true ) {
    local_30._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(&this->edges_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_28);
    (*ppEVar3)->outputs_ready_ = false;
    ppEVar3 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_28);
    (*ppEVar3)->deps_loaded_ = false;
    ppEVar3 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_28);
    (*ppEVar3)->mark_ = VisitNone;
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_28);
  }
  return;
}

Assistant:

void State::Reset() {
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i)
    i->second->ResetState();
  for (vector<Edge*>::iterator e = edges_.begin(); e != edges_.end(); ++e) {
    (*e)->outputs_ready_ = false;
    (*e)->deps_loaded_ = false;
    (*e)->mark_ = Edge::VisitNone;
  }
}